

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grovepi.c
# Opt level: O1

mraa_platform_t mraa_grovepi_platform(mraa_board_t *board,int i2c_bus)

{
  _board_t *__ptr;
  mraa_pininfo_t *__ptr_00;
  mraa_adv_func_t *pmVar1;
  
  __ptr = (_board_t *)calloc(1,0x5f0);
  if (__ptr != (_board_t *)0x0) {
    grovepi_bus = mraa_i2c_init(i2c_bus);
    if (grovepi_bus == (mraa_i2c_context)0x0) {
      syslog(4,"grovepi: Failed to initialize i2c bus %d",(ulong)(uint)i2c_bus);
    }
    else {
      mraa_i2c_address(grovepi_bus,'\x04');
      __ptr->platform_name = "grovepi";
      __ptr->platform_version = "1.2.7";
      __ptr->platform_type = MRAA_GROVEPI;
      __ptr->aio_count = 4;
      __ptr->adc_supported = 10;
      __ptr->phy_pin_count = 0xe;
      __ptr->gpio_count = 10;
      __ptr->pwm_max_period = 0x800;
      __ptr->pwm_min_period = 0x800;
      __ptr_00 = (mraa_pininfo_t *)calloc(0xe,0x2f4);
      __ptr->pins = __ptr_00;
      if (__ptr_00 != (mraa_pininfo_t *)0x0) {
        builtin_strncpy(__ptr_00->name,"IO0",4);
        __ptr_00->name[4] = '\0';
        __ptr_00->name[5] = '\0';
        __ptr_00->name[6] = '\0';
        __ptr_00->name[7] = '\0';
        *(undefined1 *)&__ptr_00->capabilities = 3;
        (__ptr_00->gpio).pinmap = 0;
        __ptr_00[1].name[0] = 'I';
        __ptr_00[1].name[1] = 'O';
        __ptr_00[1].name[2] = '1';
        __ptr_00[1].name[3] = '\0';
        __ptr_00[1].name[4] = '\0';
        __ptr_00[1].name[5] = '\0';
        __ptr_00[1].name[6] = '\0';
        __ptr_00[1].name[7] = '\0';
        *(undefined1 *)&__ptr_00[1].capabilities = 3;
        __ptr_00[1].gpio.pinmap = 1;
        __ptr_00[2].name[0] = 'I';
        __ptr_00[2].name[1] = 'O';
        __ptr_00[2].name[2] = '2';
        __ptr_00[2].name[3] = '\0';
        __ptr_00[2].name[4] = '\0';
        __ptr_00[2].name[5] = '\0';
        __ptr_00[2].name[6] = '\0';
        __ptr_00[2].name[7] = '\0';
        *(undefined1 *)&__ptr_00[2].capabilities = 3;
        __ptr_00[2].gpio.pinmap = 2;
        __ptr_00[3].name[0] = 'I';
        __ptr_00[3].name[1] = 'O';
        __ptr_00[3].name[2] = '3';
        __ptr_00[3].name[3] = '\0';
        __ptr_00[3].name[4] = '\0';
        __ptr_00[3].name[5] = '\0';
        __ptr_00[3].name[6] = '\0';
        __ptr_00[3].name[7] = '\0';
        *(undefined1 *)&__ptr_00[3].capabilities = 7;
        __ptr_00[3].gpio.pinmap = 3;
        __ptr_00[4].name[0] = 'I';
        __ptr_00[4].name[1] = 'O';
        __ptr_00[4].name[2] = '4';
        __ptr_00[4].name[3] = '\0';
        __ptr_00[4].name[4] = '\0';
        __ptr_00[4].name[5] = '\0';
        __ptr_00[4].name[6] = '\0';
        __ptr_00[4].name[7] = '\0';
        *(undefined1 *)&__ptr_00[4].capabilities = 3;
        __ptr_00[4].gpio.pinmap = 4;
        __ptr_00[5].name[0] = 'I';
        __ptr_00[5].name[1] = 'O';
        __ptr_00[5].name[2] = '5';
        __ptr_00[5].name[3] = '\0';
        __ptr_00[5].name[4] = '\0';
        __ptr_00[5].name[5] = '\0';
        __ptr_00[5].name[6] = '\0';
        __ptr_00[5].name[7] = '\0';
        *(undefined1 *)&__ptr_00[5].capabilities = 7;
        __ptr_00[5].gpio.pinmap = 5;
        __ptr_00[6].name[0] = 'I';
        __ptr_00[6].name[1] = 'O';
        __ptr_00[6].name[2] = '6';
        __ptr_00[6].name[3] = '\0';
        __ptr_00[6].name[4] = '\0';
        __ptr_00[6].name[5] = '\0';
        __ptr_00[6].name[6] = '\0';
        __ptr_00[6].name[7] = '\0';
        *(undefined1 *)&__ptr_00[6].capabilities = 7;
        __ptr_00[6].gpio.pinmap = 6;
        __ptr_00[7].name[0] = 'I';
        __ptr_00[7].name[1] = 'O';
        __ptr_00[7].name[2] = '7';
        __ptr_00[7].name[3] = '\0';
        __ptr_00[7].name[4] = '\0';
        __ptr_00[7].name[5] = '\0';
        __ptr_00[7].name[6] = '\0';
        __ptr_00[7].name[7] = '\0';
        *(undefined1 *)&__ptr_00[7].capabilities = 3;
        __ptr_00[7].gpio.pinmap = 7;
        __ptr_00[8].name[0] = 'I';
        __ptr_00[8].name[1] = 'O';
        __ptr_00[8].name[2] = '8';
        __ptr_00[8].name[3] = '\0';
        __ptr_00[8].name[4] = '\0';
        __ptr_00[8].name[5] = '\0';
        __ptr_00[8].name[6] = '\0';
        __ptr_00[8].name[7] = '\0';
        *(undefined1 *)&__ptr_00[8].capabilities = 3;
        __ptr_00[8].gpio.pinmap = 8;
        __ptr_00[9].name[0] = 'I';
        __ptr_00[9].name[1] = 'O';
        __ptr_00[9].name[2] = '9';
        __ptr_00[9].name[3] = '\0';
        __ptr_00[9].name[4] = '\0';
        __ptr_00[9].name[5] = '\0';
        __ptr_00[9].name[6] = '\0';
        __ptr_00[9].name[7] = '\0';
        *(undefined1 *)&__ptr_00[9].capabilities = 7;
        __ptr_00[9].gpio.pinmap = 9;
        __ptr_00[10].name[0] = 'A';
        __ptr_00[10].name[1] = '0';
        __ptr_00[10].name[2] = '\0';
        __ptr_00[10].name[3] = '\0';
        __ptr_00[10].name[4] = '\0';
        __ptr_00[10].name[5] = '\0';
        __ptr_00[10].name[6] = '\0';
        __ptr_00[10].name[7] = '\0';
        *(undefined1 *)&__ptr_00[10].capabilities = 0x43;
        __ptr_00[10].gpio.pinmap = 10;
        __ptr_00[10].aio.pinmap = 0;
        __ptr_00[0xb].name[0] = 'A';
        __ptr_00[0xb].name[1] = '1';
        __ptr_00[0xb].name[2] = '\0';
        __ptr_00[0xb].name[3] = '\0';
        __ptr_00[0xb].name[4] = '\0';
        __ptr_00[0xb].name[5] = '\0';
        __ptr_00[0xb].name[6] = '\0';
        __ptr_00[0xb].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xb].capabilities = 0x43;
        __ptr_00[0xb].gpio.pinmap = 0xb;
        __ptr_00[0xb].aio.pinmap = 1;
        __ptr_00[0xc].name[0] = 'A';
        __ptr_00[0xc].name[1] = '2';
        __ptr_00[0xc].name[2] = '\0';
        __ptr_00[0xc].name[3] = '\0';
        __ptr_00[0xc].name[4] = '\0';
        __ptr_00[0xc].name[5] = '\0';
        __ptr_00[0xc].name[6] = '\0';
        __ptr_00[0xc].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xc].capabilities = 0x43;
        __ptr_00[0xc].gpio.pinmap = 0xc;
        __ptr_00[0xc].aio.pinmap = 2;
        __ptr_00[0xd].name[0] = 'A';
        __ptr_00[0xd].name[1] = '3';
        __ptr_00[0xd].name[2] = '\0';
        __ptr_00[0xd].name[3] = '\0';
        __ptr_00[0xd].name[4] = '\0';
        __ptr_00[0xd].name[5] = '\0';
        __ptr_00[0xd].name[6] = '\0';
        __ptr_00[0xd].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xd].capabilities = 0x43;
        __ptr_00[0xd].gpio.pinmap = 0xd;
        __ptr_00[0xd].aio.pinmap = 3;
        pmVar1 = (mraa_adv_func_t *)calloc(1,0x288);
        __ptr->adv_func = pmVar1;
        if (pmVar1 != (mraa_adv_func_t *)0x0) {
          pmVar1->gpio_init_internal_replace = mraa_grovepi_gpio_init_internal_replace;
          pmVar1->gpio_mode_replace = mraa_grovepi_gpio_mode_replace;
          pmVar1->gpio_dir_replace = mraa_grovepi_gpio_dir_replace;
          pmVar1->gpio_read_replace = mraa_grovepi_gpio_read_replace;
          pmVar1->gpio_write_replace = mraa_grovepi_gpio_write_replace;
          pmVar1->gpio_close_replace = mraa_grovepi_gpio_close_replace;
          pmVar1->aio_init_internal_replace = mraa_grovepi_aio_init_internal_replace;
          pmVar1->aio_read_replace = mraa_grovepi_aio_read_replace;
          pmVar1->pwm_init_internal_replace = mraa_grovepi_pwm_init_internal_replace;
          pmVar1->pwm_write_replace = mraa_grovepi_pwm_write_replace;
          pmVar1->pwm_read_replace = mraa_grovepi_pwm_read_replace;
          pmVar1->pwm_enable_replace = mraa_grovepi_pwm_enable_replace;
          pmVar1->pwm_period_replace = mraa_grovepi_pwm_period_replace;
          board->sub_platform = __ptr;
          return MRAA_GROVEPI;
        }
        free(__ptr_00);
      }
    }
    free(__ptr);
  }
  return MRAA_NULL_PLATFORM;
}

Assistant:

mraa_platform_t
mraa_grovepi_platform(mraa_board_t* board, const int i2c_bus)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return MRAA_NULL_PLATFORM;
    }

    grovepi_bus = mraa_i2c_init(i2c_bus);
    if (grovepi_bus == NULL) {
        syslog(LOG_WARNING, "grovepi: Failed to initialize i2c bus %d", i2c_bus);
        free(b);
        return MRAA_NULL_PLATFORM;
    }
    mraa_i2c_address(grovepi_bus, GROVEPI_ADDRESS);

    b->platform_name = "grovepi";
    b->platform_version = "1.2.7"; // TODO: add firmware query function
    b->platform_type = MRAA_GROVEPI;
    b->gpio_count = 10;
    b->aio_count = 4;
    b->adc_supported = 10;
    b->phy_pin_count = 14;
    b->pwm_min_period = 2048;
    b->pwm_max_period = 2048;

    b->pins = (mraa_pininfo_t*) calloc(b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b);
        return MRAA_NULL_PLATFORM;
    }

    strncpy(b->pins[0].name, "IO0", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[0].gpio.pinmap = 0;
    strncpy(b->pins[1].name, "IO1", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[1].gpio.pinmap = 1;
    strncpy(b->pins[2].name, "IO2", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[2].gpio.pinmap = 2;
    strncpy(b->pins[3].name, "IO3", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[3].gpio.pinmap = 3;
    strncpy(b->pins[4].name, "IO4", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[4].gpio.pinmap = 4;
    strncpy(b->pins[5].name, "IO5", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[5].gpio.pinmap = 5;
    strncpy(b->pins[6].name, "IO6", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[6].gpio.pinmap = 6;
    strncpy(b->pins[7].name, "IO7", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[7].gpio.pinmap = 7;
    strncpy(b->pins[8].name, "IO8", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[8].gpio.pinmap = 8;
    strncpy(b->pins[9].name, "IO9", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[9].gpio.pinmap = 9;
    strncpy(b->pins[10].name, "A0", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[10].gpio.pinmap = 10;
    b->pins[10].aio.pinmap = 0;
    strncpy(b->pins[11].name, "A1", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[11].gpio.pinmap = 11;
    b->pins[11].aio.pinmap = 1;
    strncpy(b->pins[12].name, "A2", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[12].gpio.pinmap = 12;
    b->pins[12].aio.pinmap = 2;
    strncpy(b->pins[13].name, "A3", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[13].gpio.pinmap = 13;
    b->pins[13].aio.pinmap = 3;

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        free(b);
        return MRAA_NULL_PLATFORM;
    }

    b->adv_func->gpio_init_internal_replace = &mraa_grovepi_gpio_init_internal_replace;
    b->adv_func->gpio_mode_replace = &mraa_grovepi_gpio_mode_replace;
    b->adv_func->gpio_dir_replace = &mraa_grovepi_gpio_dir_replace;
    //TODO: add interrupt support
    //b->adv_func->gpio_edge_mode_replace = &mraa_grovepi_gpio_edge_mode_replace;
    //b->adv_func->gpio_interrupt_handler_init_replace = &mraa_grovepi_gpio_interrupt_handler_init_replace;
    //b->adv_func->gpio_wait_interrupt_replace = &mraa_grovepi_gpio_wait_interrupt_replace;
    b->adv_func->gpio_read_replace = &mraa_grovepi_gpio_read_replace;
    b->adv_func->gpio_write_replace = &mraa_grovepi_gpio_write_replace;
    b->adv_func->gpio_close_replace = &mraa_grovepi_gpio_close_replace;

    b->adv_func->aio_init_internal_replace = &mraa_grovepi_aio_init_internal_replace;
    b->adv_func->aio_read_replace = &mraa_grovepi_aio_read_replace;

    b->adv_func->pwm_init_internal_replace = &mraa_grovepi_pwm_init_internal_replace;
    b->adv_func->pwm_write_replace = &mraa_grovepi_pwm_write_replace;
    b->adv_func->pwm_read_replace = &mraa_grovepi_pwm_read_replace;
    b->adv_func->pwm_enable_replace = &mraa_grovepi_pwm_enable_replace;
    b->adv_func->pwm_period_replace = &mraa_grovepi_pwm_period_replace;

    board->sub_platform = b;

    return b->platform_type;
}